

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim.cc
# Opt level: O1

void __thiscall kratos::Simulator::process_stmt(Simulator *this,SwitchStmt *switch_,Var *var)

{
  _Rb_tree_header *p_Var1;
  Var *var_00;
  long lVar2;
  StmtBlock *pSVar3;
  int iVar4;
  int iVar5;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  _Rb_tree_header *p_Var10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var11;
  optional<unsigned_long> oVar12;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *__range2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  Var *local_40;
  Simulator *local_38;
  
  var_00 = (switch_->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var11 = (switch_->target_).super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  local_40 = var;
  local_38 = this;
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
    }
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
    }
  }
  oVar12 = get_value_(local_38,var_00);
  p_Var1 = &(switch_->body_)._M_t._M_impl.super__Rb_tree_header;
  if (((undefined1  [16])
       oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) == (undefined1  [16])0x0
     ) {
    p_Var7 = &p_Var1->_M_header;
    for (p_Var9 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0; p_Var9 = p_Var9->_M_left) {
      p_Var7 = p_Var9;
    }
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var7, ((_Rb_tree_header *)p_Var7)->_M_node_count != 0)) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 == p_Var1) {
      return;
    }
    __range2 = (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar8 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::at(&switch_->body_,(key_type *)&__range2);
    pSVar3 = &((pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_StmtBlock;
    p_Var11 = (pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    }
    process_stmt(local_38,pSVar3,local_40);
  }
  else {
    for (p_Var6 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var6 != p_Var1;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      if (*(long *)(p_Var6 + 1) == 0) {
        iVar5 = 3;
      }
      else {
        lVar2 = *(long *)(*(long *)(p_Var6 + 1) + 0x270);
        iVar4 = (*(var_00->super_IRNode)._vptr_IRNode[7])(var_00);
        iVar5 = 0;
        if (oVar12.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_payload ==
            (ulong)(lVar2 << ((byte)iVar4 & 0x3f)) >> ((byte)iVar4 & 0x3f)) {
          process_stmt(local_38,(StmtBlock *)p_Var6[1]._M_left,local_40);
          iVar5 = 1;
        }
      }
      if ((iVar5 != 3) && (iVar5 != 0)) {
        if ((_Rb_tree_header *)p_Var6 != p_Var1) {
          return;
        }
        break;
      }
    }
    p_Var7 = &p_Var1->_M_header;
    for (p_Var9 = (switch_->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0; p_Var9 = p_Var9->_M_left) {
      p_Var7 = p_Var9;
    }
    p_Var10 = p_Var1;
    if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
       (p_Var10 = (_Rb_tree_header *)p_Var7, ((_Rb_tree_header *)p_Var7)->_M_node_count != 0)) {
      p_Var10 = p_Var1;
    }
    if (p_Var10 == p_Var1) {
      return;
    }
    __range2 = (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                *)0x0;
    _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar8 = std::
             map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
             ::at(&switch_->body_,(key_type *)&__range2);
    pSVar3 = &((pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->super_StmtBlock;
    p_Var11 = (pmVar8->super___shared_ptr<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var11->_M_use_count = p_Var11->_M_use_count + 1;
      }
    }
    if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
    }
    process_stmt(local_38,pSVar3,local_40);
  }
  if (p_Var11 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var11);
  }
  return;
}

Assistant:

void Simulator::process_stmt(kratos::SwitchStmt *switch_, const Var *var) {
    auto *target = switch_->target().get();
    auto val = get_value_(target);
    auto const &body = switch_->body();
    if (!val) {
        // go to default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    } else {
        auto value = *val;
        for (auto const &[cond, stmt] : body) {
            // we compare bits
            if (!cond) continue;
            int64_t cond_val = cond->value();
            int64_t *v_p = &cond_val;
            uint64_t bits = *(reinterpret_cast<uint64_t *>(v_p));
            bits &= (0xFFFFFFFFFFFFFFFF >> target->width());
            if (value == bits) {
                process_stmt(stmt.get(), var);
                return;
            }
        }
        // default case
        if (body.find(nullptr) != body.end()) {
            auto stmt = body.at(nullptr);
            process_stmt(stmt.get(), var);
        }
    }
}